

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_builder_twolevel.cpp
# Opt level: O2

Builder * embree::sse2::BVH4BuilderTwoLevelInstanceSAH
                    (void *bvh,Scene *scene,GTypeMask gtype,bool useMortonBuilder)

{
  BVHNBuilderTwoLevel<4,_embree::Instance,_embree::InstancePrimitive> *this;
  
  this = (BVHNBuilderTwoLevel<4,_embree::Instance,_embree::InstancePrimitive> *)::operator_new(0xa8)
  ;
  BVHNBuilderTwoLevel<4,_embree::Instance,_embree::InstancePrimitive>::BVHNBuilderTwoLevel
            (this,(BVH *)bvh,scene,gtype,useMortonBuilder,0x400);
  return (Builder *)this;
}

Assistant:

Builder* BVH4BuilderTwoLevelInstanceSAH (void* bvh, Scene* scene, Geometry::GTypeMask gtype, bool useMortonBuilder) {
      return new BVHNBuilderTwoLevel<4,Instance,InstancePrimitive>((BVH4*)bvh,scene,gtype,useMortonBuilder);
    }